

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

bool common::ReadSettings
               (path *path,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *values,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *errors)

{
  pointer pbVar1;
  bool bVar2;
  char cVar3;
  ssize_t sVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar7;
  long lVar8;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long lVar9;
  long in_FS_OFFSET;
  bool bVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_bool>
  pVar11;
  string local_2f8;
  undefined1 local_2d8 [32];
  SettingsValue in;
  string local_260;
  ifstream file;
  byte abStack_220 [200];
  undefined8 auStack_158 [36];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::clear(&values->_M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(errors);
  bVar2 = std::filesystem::exists(&path->super_path);
  bVar10 = true;
  if (!bVar2) goto LAB_00578a7c;
  std::ifstream::ifstream(&file);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<fs::path>(&file,path,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::filesystem::__cxx11::path::string(&local_260,&path->super_path);
    tinyformat::format<std::__cxx11::string>
              ((string *)&in,(tinyformat *)"%s. Please check permissions.",(char *)&local_260,in_RCX
              );
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in);
    std::__cxx11::string::~string((string *)&in);
    std::__cxx11::string::~string((string *)&local_260);
    bVar10 = false;
  }
  else {
    in.val._M_dataplus._M_p = (pointer)&in.val.field_2;
    in.val._M_string_length = 0;
    in.val.field_2._M_local_buf[0] = '\0';
    in.typ = VNULL;
    in.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    in.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    in.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    in.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    in.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    in.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffff;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_260,*(undefined8 *)((long)auStack_158 + *(long *)(_file + -0x18)));
    sVar4 = UniValue::read(&in,(int)local_260._M_string_length,local_260._M_dataplus._M_p,
                           (size_t)args);
    std::__cxx11::string::~string((string *)&local_260);
    if ((char)sVar4 == '\0') {
      std::filesystem::__cxx11::path::string((string *)local_2d8,&path->super_path);
      tinyformat::format<std::__cxx11::string>
                (&local_260,
                 (tinyformat *)
                 "Settings file %s does not contain valid JSON. This is probably caused by disk corruption or a crash, and can be fixed by removing the file, which will reset settings to default values."
                 ,local_2d8,args);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                 &local_260);
LAB_00578a4c:
      this = &local_260;
LAB_00578a54:
      std::__cxx11::string::~string((string *)this);
      std::__cxx11::string::~string((string *)local_2d8);
      bVar10 = false;
    }
    else {
      if ((abStack_220[*(long *)(_file + -0x18)] & 5) != 0) {
        std::filesystem::__cxx11::path::string((string *)local_2d8,&path->super_path);
        tinyformat::format<std::__cxx11::string>
                  (&local_260,(tinyformat *)"Failed reading settings file %s",local_2d8,args);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                   &local_260);
        goto LAB_00578a4c;
      }
      std::ifstream::close();
      if (in.typ != VOBJ) {
        UniValue::write_abi_cxx11_((UniValue *)local_2d8,(int)&in,(void *)0x0,0);
        std::filesystem::__cxx11::path::string(&local_2f8,&path->super_path);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_260,(tinyformat *)"Found non-object value %s in settings file %s",
                   local_2d8,&local_2f8,args_1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                   &local_260);
        std::__cxx11::string::~string((string *)&local_260);
        this = &local_2f8;
        goto LAB_00578a54;
      }
      pvVar5 = UniValue::getKeys_abi_cxx11_(&in);
      pvVar6 = UniValue::getValues(&in);
      lVar9 = 0;
      lVar8 = 0;
      for (uVar7 = 0;
          pbVar1 = (pvVar5->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)(pvVar5->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
          uVar7 = uVar7 + 1) {
        pVar11 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue>,std::_Select1st<std::pair<std::__cxx11::string_const,UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>
                 ::_M_emplace_unique<std::__cxx11::string_const&,UniValue_const&>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue>,std::_Select1st<std::pair<std::__cxx11::string_const,UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>
                             *)values,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar8),
                            (UniValue *)
                            ((long)&((pvVar6->
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->typ + lVar9));
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pbVar1 = (pvVar5->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::filesystem::__cxx11::path::string((string *)local_2d8,&path->super_path);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_260,(tinyformat *)"Found duplicate key %s in settings file %s",
                     (char *)((long)&(pbVar1->_M_dataplus)._M_p + lVar8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                     args_1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                     &local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)local_2d8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
          ::clear(&values->_M_t);
          break;
        }
        lVar8 = lVar8 + 0x20;
        lVar9 = lVar9 + 0x58;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
      ::erase(&values->_M_t,(key_type *)(anonymous_namespace)::SETTINGS_WARN_MSG_KEY_abi_cxx11_);
      bVar10 = (errors->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start ==
               (errors->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    UniValue::~UniValue(&in);
  }
  std::ifstream::~ifstream(&file);
LAB_00578a7c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool ReadSettings(const fs::path& path, std::map<std::string, SettingsValue>& values, std::vector<std::string>& errors)
{
    values.clear();
    errors.clear();

    // Ok for file to not exist
    if (!fs::exists(path)) return true;

    std::ifstream file;
    file.open(path);
    if (!file.is_open()) {
      errors.emplace_back(strprintf("%s. Please check permissions.", fs::PathToString(path)));
      return false;
    }

    SettingsValue in;
    if (!in.read(std::string{std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>()})) {
        errors.emplace_back(strprintf("Settings file %s does not contain valid JSON. This is probably caused by disk corruption or a crash, "
                                      "and can be fixed by removing the file, which will reset settings to default values.",
                                      fs::PathToString(path)));
        return false;
    }

    if (file.fail()) {
        errors.emplace_back(strprintf("Failed reading settings file %s", fs::PathToString(path)));
        return false;
    }
    file.close(); // Done with file descriptor. Release while copying data.

    if (!in.isObject()) {
        errors.emplace_back(strprintf("Found non-object value %s in settings file %s", in.write(), fs::PathToString(path)));
        return false;
    }

    const std::vector<std::string>& in_keys = in.getKeys();
    const std::vector<SettingsValue>& in_values = in.getValues();
    for (size_t i = 0; i < in_keys.size(); ++i) {
        auto inserted = values.emplace(in_keys[i], in_values[i]);
        if (!inserted.second) {
            errors.emplace_back(strprintf("Found duplicate key %s in settings file %s", in_keys[i], fs::PathToString(path)));
            values.clear();
            break;
        }
    }

    // Remove auto-generated warning comment from the accessible settings.
    values.erase(SETTINGS_WARN_MSG_KEY);

    return errors.empty();
}